

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::ParseableFunctionInfo::CleanupToReparse(ParseableFunctionInfo *this)

{
  byte *pbVar1;
  NestedArray *pNVar2;
  FunctionProxy *this_00;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  FunctionInfo *pFVar6;
  ParseableFunctionInfo *this_01;
  ulong uVar7;
  
  bVar4 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
  if (bVar4) {
    bVar4 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar4) goto LAB_0076148f;
      *puVar5 = 0;
    }
    pbVar1 = (byte *)((long)&this[1].super_FunctionProxy.super_FinalizableObject.
                             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1);
    *pbVar1 = *pbVar1 & 0xfe;
  }
  pNVar2 = (this->nestedArray).ptr;
  if ((pNVar2 != (NestedArray *)0x0) && (pNVar2->nestedCount != 0)) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar7 = 0;
    do {
      this_00 = *(FunctionProxy **)((long)pNVar2[uVar7 + 1] + 8);
      if (this_00 != (FunctionProxy *)0x0) {
        pFVar6 = (this_00->functionInfo).ptr;
        if (pFVar6 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x561,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar4) goto LAB_0076148f;
          *puVar5 = 0;
          pFVar6 = (this_00->functionInfo).ptr;
        }
        if ((pFVar6->functionBodyImpl).ptr != this_00) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x562,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                      "GetFunctionInfo()->GetFunctionProxy() == this");
          if (!bVar4) goto LAB_0076148f;
          *puVar5 = 0;
          pFVar6 = (this_00->functionInfo).ptr;
        }
        if (((pFVar6->attributes & CanDefer) == None) || (pFVar6->compileCount == 0)) {
          bVar4 = FunctionProxy::IsFunctionBody(this_00);
          if (!bVar4) goto LAB_007613e5;
        }
        this_01 = FunctionProxy::GetParseableFunctionInfo(this_00);
        CleanupToReparse(this_01);
      }
LAB_007613e5:
      uVar7 = uVar7 + 1;
    } while (uVar7 < pNVar2->nestedCount);
  }
  CleanupToReparseHelper(this);
  bVar4 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
  if (!bVar4) {
    return;
  }
  bVar4 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
    if (!bVar4) {
LAB_0076148f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  FunctionBody::CleanupToReparseHelper((FunctionBody *)this);
  return;
}

Assistant:

void ParseableFunctionInfo::CleanupToReparse()
    {
#if DBG
        if (this->IsFunctionBody())
        {
            GetFunctionBody()->UnlockCounters();
        }
#endif
        // The current function is already compiled. In order to prep this function to ready for debug mode, most of the previous information need to be thrown away.
        // Clean up the nested functions
        this->ForEachNestedFunc([&](FunctionProxy* proxy, uint32 index)
        {
            // Note: redeferred functions may have fully compiled children. If we find a redeferred function, keep walking.
            if (proxy && ((proxy->CanBeDeferred() && proxy->GetFunctionInfo()->GetCompileCount() > 0) || proxy->IsFunctionBody()))
            {
                proxy->GetParseableFunctionInfo()->CleanupToReparse();
            }
            return true;
        });

        this->CleanupToReparseHelper();
        if (this->IsFunctionBody())
        {
            this->GetFunctionBody()->CleanupToReparseHelper();
        }
    }